

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O3

void __thiscall
TEST_MockReturnValueTest_FunctionPointerReturnValue_Test::testBody
          (TEST_MockReturnValueTest_FunctionPointerReturnValue_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  UtestShell *pUVar4;
  _func_void *p_Var5;
  TestTerminator *pTVar6;
  undefined8 uVar7;
  undefined4 extraout_var_01;
  SimpleString local_78;
  MockNamedValue local_68;
  undefined4 extraout_var_00;
  
  SimpleString::SimpleString((SimpleString *)&local_68,"");
  pMVar2 = mock((SimpleString *)&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_78);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x118))
            ((long *)CONCAT44(extraout_var,iVar1),0x107);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  SimpleString::SimpleString((SimpleString *)&local_68,"");
  pMVar2 = mock((SimpleString *)&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_78);
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  pUVar4 = UtestShell::getCurrent();
  (**(code **)(*plVar3 + 0xa8))(&local_68,plVar3);
  p_Var5 = MockNamedValue::getFunctionPointerValue(&local_68);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x14])
            (pUVar4,0x107,p_Var5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2de,pTVar6);
  MockNamedValue::~MockNamedValue(&local_68);
  pUVar4 = UtestShell::getCurrent();
  uVar7 = (**(code **)(*plVar3 + 0x160))(plVar3);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x14])
            (pUVar4,0x107,uVar7,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2df,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)&local_68,"");
  pMVar2 = mock((SimpleString *)&local_68,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[0x20])(pMVar2);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x14])
            (pUVar4,0x107,CONCAT44(extraout_var_01,iVar1),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2e0,pTVar6);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  return;
}

Assistant:

TEST(MockReturnValueTest, FunctionPointerReturnValue)
{
    void (*ptr)() = (void(*)()) 0x00107;
    mock().expectOneCall("foo").andReturnValue(ptr);
    MockActualCall& actual_call = mock().actualCall("foo");

    FUNCTIONPOINTERS_EQUAL(ptr, actual_call.returnValue().getFunctionPointerValue());
    FUNCTIONPOINTERS_EQUAL(ptr, actual_call.returnFunctionPointerValue());
    FUNCTIONPOINTERS_EQUAL(ptr, mock().functionPointerReturnValue());
}